

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O2

shared_ptr<const_Diligent::ShaderResourcesGL> * __thiscall
Diligent::GLProgram::LoadResources
          (GLProgram *this,SHADER_TYPE ShaderStages,PIPELINE_RESOURCE_FLAGS SamplerResourceFlag,
          GLContextState *State,bool LoadUniformBufferReflection,SHADER_SOURCE_LANGUAGE SourceLang)

{
  _Head_base<0UL,_Diligent::ShaderResourcesGL_*,_false> __p;
  unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
  pResources;
  string msg;
  _Head_base<0UL,_Diligent::ShaderResourcesGL_*,_false> local_60;
  SHADER_SOURCE_LANGUAGE local_54;
  undefined1 local_50 [32];
  
  local_54 = SourceLang;
  if (this->m_LinkStatus != Succeeded) {
    FormatString<char[54]>
              ((string *)local_50,
               (char (*) [54])"Program must be successfully linked to load resources");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_50._4_4_,local_50._0_4_),"LoadResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x90);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((this->m_pResources).
      super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    FormatString<char[35]>((string *)local_50,(char (*) [35])"Resources have already been loaded");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_50._4_4_,local_50._0_4_),"LoadResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::make_unique<Diligent::ShaderResourcesGL>();
  local_50[4] = SamplerResourceFlag;
  local_50._28_4_ = local_54;
  local_50._0_4_ = ShaderStages;
  local_50._8_8_ = this;
  local_50._16_8_ = State;
  local_50[0x18] = LoadUniformBufferReflection;
  ShaderResourcesGL::LoadUniforms(local_60._M_head_impl,(LoadUniformsAttribs *)local_50);
  __p._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (ShaderResourcesGL *)0x0;
  std::__shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>::
  reset<Diligent::ShaderResourcesGL>
            (&(this->m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>,
             __p._M_head_impl);
  std::unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>::
  ~unique_ptr((unique_ptr<Diligent::ShaderResourcesGL,_std::default_delete<Diligent::ShaderResourcesGL>_>
               *)&local_60);
  return &this->m_pResources;
}

Assistant:

std::shared_ptr<const ShaderResourcesGL>& GLProgram::LoadResources(SHADER_TYPE             ShaderStages,
                                                                   PIPELINE_RESOURCE_FLAGS SamplerResourceFlag,
                                                                   GLContextState&         State,
                                                                   bool                    LoadUniformBufferReflection,
                                                                   SHADER_SOURCE_LANGUAGE  SourceLang)
{
    DEV_CHECK_ERR(m_LinkStatus == LinkStatus::Succeeded, "Program must be successfully linked to load resources");
    VERIFY(m_pResources == nullptr, "Resources have already been loaded");

    std::unique_ptr<ShaderResourcesGL> pResources = std::make_unique<ShaderResourcesGL>();
    pResources->LoadUniforms(
        {
            ShaderStages,
            SamplerResourceFlag,
            m_GLProg,
            State,
            LoadUniformBufferReflection,
            SourceLang,
        });
    m_pResources.reset(pResources.release());

    return m_pResources;
}